

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O2

void __thiscall Fluid_Image::~Fluid_Image(Fluid_Image *this)

{
  uint uVar1;
  Fluid_Image **ppFVar2;
  long lVar3;
  long lVar4;
  
  ppFVar2 = images;
  if (images != (Fluid_Image **)0x0) {
    lVar4 = 0;
    do {
      lVar3 = lVar4;
      lVar4 = lVar3 + 1;
    } while (images[lVar3] != this);
    numimages = numimages - 1;
    uVar1 = numimages;
    if (numimages < (int)(uint)lVar3) {
      uVar1 = (uint)lVar3;
    }
    for (; (ulong)uVar1 + 1 != lVar4; lVar4 = lVar4 + 1) {
      ppFVar2[lVar4 + -1] = ppFVar2[lVar4];
    }
  }
  if (this->img != (Fl_Shared_Image *)0x0) {
    Fl_Shared_Image::release(this->img);
  }
  free(this->name_);
  return;
}

Assistant:

Fluid_Image::~Fluid_Image() {
  int a;
  if (images) {
    for (a = 0;; a++) if (images[a] == this) break;
    numimages--;
    for (; a < numimages; a++) images[a] = images[a+1];
  }
  if (img) img->release();
  free((void*)name_);
}